

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

parser_error parse_prefs_monster_base(parser *p)

{
  monster_race *pmVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  byte *pbVar4;
  char *name_00;
  monster_base *pmVar5;
  monster_race *race;
  prefs_data *d;
  wchar_t c;
  uint8_t a;
  size_t i;
  monster_base *mb;
  char *name;
  parser *p_local;
  
  pbVar4 = (byte *)parser_priv(p);
  if (pbVar4 == (byte *)0x0) {
    __assert_fail("d != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-prefs.c"
                  ,0x2c6,"enum parser_error parse_prefs_monster_base(struct parser *)");
  }
  if ((*pbVar4 & 1) == 0) {
    name_00 = parser_getsym(p,"name");
    pmVar5 = lookup_monster_base(name_00);
    if (pmVar5 == (monster_base *)0x0) {
      p_local._4_4_ = PARSE_ERROR_NO_KIND_FOUND;
    }
    else {
      wVar2 = parser_getint(p,"attr");
      wVar3 = parser_getint(p,"char");
      for (_c = 0; pmVar1 = r_info, _c < z_info->r_max; _c = _c + 1) {
        if (r_info[_c].base == pmVar5) {
          monster_x_attr[r_info[_c].ridx] = (uint8_t)wVar2;
          monster_x_char[pmVar1[_c].ridx] = wVar3;
        }
      }
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  else {
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_prefs_monster_base(struct parser *p)
{
	const char *name;
	struct monster_base *mb;
	size_t i;
	uint8_t a;
	wchar_t c;

	struct prefs_data *d = parser_priv(p);
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	name = parser_getsym(p, "name");
	mb = lookup_monster_base(name);
	if (!mb)
		return PARSE_ERROR_NO_KIND_FOUND;
	a = (uint8_t)parser_getint(p, "attr");
	c = (wchar_t)parser_getint(p, "char");

	for (i = 0; i < z_info->r_max; i++) {
		struct monster_race *race = &r_info[i];

		if (race->base != mb) continue;

		monster_x_attr[race->ridx] = a;
		monster_x_char[race->ridx] = c;
	}

	return PARSE_ERROR_NONE;
}